

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void cf_hmac_drbg_init(cf_hmac_drbg *ctx,cf_chash *hash,void *entropy,size_t nentropy,void *nonce,
                      size_t nnonce,void *persn,size_t npersn)

{
  uint8_t local_78 [8];
  uint8_t initial_key [64];
  size_t nnonce_local;
  void *nonce_local;
  size_t nentropy_local;
  void *entropy_local;
  cf_chash *hash_local;
  cf_hmac_drbg *ctx_local;
  
  initial_key._56_8_ = nnonce;
  mem_clean(ctx,800);
  if (0x40 < hash->hashsz) {
    abort();
  }
  memset(local_78,0,hash->hashsz);
  memset(ctx,1,hash->hashsz);
  cf_hmac_init(&ctx->hmac,hash,local_78,hash->hashsz);
  hmac_drbg_update(ctx,entropy,nentropy,nonce,initial_key._56_8_,persn,npersn);
  ctx->reseed_counter = 1;
  return;
}

Assistant:

void cf_hmac_drbg_init(cf_hmac_drbg *ctx,
                       const cf_chash *hash,
                       const void *entropy, size_t nentropy,
                       const void *nonce, size_t nnonce,
                       const void *persn, size_t npersn)
{
  mem_clean(ctx, sizeof *ctx);

  assert(hash->hashsz <= CF_MAXHASH);

  /* 2. Key = 0x00 00 ... 00
   * 3. V = 0x01 01 ... 01 */
  uint8_t initial_key[CF_MAXHASH];
  memset(initial_key, 0x00, hash->hashsz);
  memset(ctx->V, 0x01, hash->hashsz);
  cf_hmac_init(&ctx->hmac, hash, initial_key, hash->hashsz);

  /* 1. seed_material = entropy_input || nonce || personalization_string
   * 4. (Key, V) = HMAC_DRBG_Update(seed_material, Key, V) */
  hmac_drbg_update(ctx, entropy, nentropy, nonce, nnonce, persn, npersn);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}